

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O2

tuple<double,_double> bounds<double>(double y)

{
  uint uVar1;
  _Head_base<1UL,_double,_false> *in_RDI;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  tuple<double,_double> tVar6;
  
  dVar3 = y * 0.9999999999999882;
  dVar4 = y * 1.0000000000000118;
  uVar1 = (uint)(dVar4 < dVar3);
  auVar5._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar5._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar5._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  tVar6.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       (double)(~auVar5._0_8_ & (ulong)dVar4 | (ulong)dVar3 & auVar5._0_8_);
  dVar3 = (double)(~auVar5._8_8_ & (ulong)dVar3 | (ulong)dVar4 & auVar5._8_8_);
  uVar2 = -(ulong)(ABS(dVar3) < 1.1792891450088167e-306);
  tVar6.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       (double)(-(ulong)(ABS(tVar6.super__Tuple_impl<0UL,_double,_double>.
                             super__Head_base<0UL,_double,_false>._M_head_impl) <
                        1.1792891450088167e-306) & 0x6a800000000000 |
               ~-(ulong)(ABS(tVar6.super__Tuple_impl<0UL,_double,_double>.
                             super__Head_base<0UL,_double,_false>._M_head_impl) <
                        1.1792891450088167e-306) &
               (ulong)tVar6.super__Tuple_impl<0UL,_double,_double>.
                      super__Head_base<0UL,_double,_false>._M_head_impl);
  in_RDI->_M_head_impl =
       tVar6.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
       super__Head_base<1UL,_double,_false>._M_head_impl;
  in_RDI[1]._M_head_impl = (double)(uVar2 & 0x806a800000000000 | ~uVar2 & (ulong)dVar3);
  return (tuple<double,_double>)tVar6.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<T, T> bounds(T y) {
  const T tol{std::numeric_limits<T>::digits *
              std::log2(static_cast<T>(std::numeric_limits<T>::radix))};
  const T eps{tol * std::numeric_limits<T>::epsilon()};
  const T min{tol * std::numeric_limits<T>::min()};
  T y_min{(1 - eps) * y};
  T y_max{(1 + eps) * y};
  if (y_min > y_max)
    std::swap(y_min, y_max);
  if (std::abs(y_min) < min)
    y_min = -min;
  if (std::abs(y_max) < min)
    y_max = +min;
  return {y_min, y_max};
}